

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::ShowSection(TemplateDictionary *this,TemplateString section_name)

{
  UnsafeArena *pUVar1;
  small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *psVar2;
  BaseArena *this_00;
  TemplateDictionary *template_global_dict_owner;
  iterator __position;
  int iVar3;
  SectionDict *pSVar4;
  TemplateDictionary *this_01;
  vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
  *this_02;
  char *pcVar5;
  data_type *ppvVar6;
  TemplateDictionary *local_80;
  TemplateString local_78;
  TemplateString local_58;
  
  if (this->section_dict_ == (SectionDict *)0x0) {
    pSVar4 = (SectionDict *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x50,8);
    pUVar1 = this->arena_;
    pSVar4->size_ = 0;
    (pSVar4->functor_).arena_ = pUVar1;
    this->section_dict_ = pSVar4;
  }
  psVar2 = this->section_dict_;
  local_78.ptr_ = (char *)TemplateString::GetGlobalId(&section_name);
  iVar3 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
          ::count(psVar2,(key_type *)&local_78);
  if (iVar3 == 0) {
    local_78.ptr_ = "empty dictionary";
    local_78.length_ = 0x10;
    local_78.is_immutable_ = false;
    local_78.id_ = 0;
    this_00 = &this->arena_->super_BaseArena;
    template_global_dict_owner = this->template_global_dict_owner_;
    this_01 = (TemplateDictionary *)BaseArena::GetMemory(this_00,0x70,8);
    TemplateDictionary(this_01,&local_78,(UnsafeArena *)this_00,this,template_global_dict_owner);
    local_80 = this_01;
    this_02 = (vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
               *)BaseArena::GetMemory(&this->arena_->super_BaseArena,0x20,8);
    *(UnsafeArena **)this_02 = this->arena_;
    *(undefined8 *)(this_02 + 8) = 0;
    *(undefined8 *)(this_02 + 0x10) = 0;
    *(undefined8 *)(this_02 + 0x18) = 0;
    __position._M_current = *(TemplateDictionary ***)(this_02 + 0x10);
    if (__position._M_current == *(TemplateDictionary ***)(this_02 + 0x18)) {
      std::
      vector<ctemplate::TemplateDictionary*,ctemplate::ArenaAllocator<ctemplate::TemplateDictionary*,ctemplate::UnsafeArena>>
      ::_M_realloc_insert<ctemplate::TemplateDictionary*const&>(this_02,__position,&local_80);
    }
    else {
      *__position._M_current = local_80;
      *(long *)(this_02 + 0x10) = *(long *)(this_02 + 0x10) + 8;
    }
    psVar2 = this->section_dict_;
    local_58.is_immutable_ = section_name.is_immutable_;
    local_58._17_7_ = section_name._17_7_;
    local_58.id_ = section_name.id_;
    local_58.ptr_ = section_name.ptr_;
    local_58.length_ = section_name.length_;
    pcVar5 = (char *)TemplateString::GetGlobalId(&local_58);
    local_78.ptr_ = pcVar5;
    ppvVar6 = small_map<std::map<unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_std::vector<ctemplate::TemplateDictionary_*,_ctemplate::ArenaAllocator<ctemplate::TemplateDictionary_*,_ctemplate::UnsafeArena>_>_*>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
              ::operator[](psVar2,(key_type *)&local_78);
    *ppvVar6 = (data_type)this_02;
    if (local_58.id_ == 0) {
      local_78.ptr_ = local_58.ptr_;
      local_78.length_ = local_58.length_;
      local_78.is_immutable_ = local_58.is_immutable_;
      local_78.id_ = (TemplateId)pcVar5;
      TemplateString::AddToGlobalIdToNameMap(&local_78);
    }
  }
  return;
}

Assistant:

void TemplateDictionary::ShowSection(const TemplateString section_name) {
  LazilyCreateDict(&section_dict_);
  if (!section_dict_->count(section_name.GetGlobalId())) {
    TemplateDictionary* empty_dict = CreateTemplateSubdict(
        "empty dictionary", arena_, this, template_global_dict_owner_);
    DictVector* sub_dict = CreateDictVector();
    sub_dict->push_back(empty_dict);
    HashInsert(section_dict_, section_name, sub_dict);
  }
}